

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamecontroller.cpp
# Opt level: O1

void __thiscall IGameController::OnReset(IGameController *this)

{
  int iVar1;
  CPlayer *pCVar2;
  int i;
  long lVar3;
  
  lVar3 = 0;
  do {
    pCVar2 = this->m_pGameServer->m_apPlayers[lVar3];
    if (pCVar2 != (CPlayer *)0x0) {
      pCVar2->m_RespawnDisabled = false;
      CPlayer::Respawn(pCVar2);
      iVar1 = this->m_pServer->m_CurrentGameTick;
      pCVar2 = this->m_pGameServer->m_apPlayers[lVar3];
      pCVar2->m_RespawnTick = this->m_pServer->m_TickSpeed / 2 + iVar1;
      if (this->m_RoundCount == 0) {
        pCVar2->m_Score = 0;
        pCVar2->m_ScoreStartTick = iVar1;
      }
      pCVar2->m_IsReadyToPlay = true;
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x40);
  return;
}

Assistant:

void IGameController::OnReset()
{
	for(int i = 0; i < MAX_CLIENTS; i++)
	{
		if(GameServer()->m_apPlayers[i])
		{
			GameServer()->m_apPlayers[i]->m_RespawnDisabled = false;
			GameServer()->m_apPlayers[i]->Respawn();
			GameServer()->m_apPlayers[i]->m_RespawnTick = Server()->Tick()+Server()->TickSpeed()/2;
			if(m_RoundCount == 0)
			{
				GameServer()->m_apPlayers[i]->m_Score = 0;
				GameServer()->m_apPlayers[i]->m_ScoreStartTick = Server()->Tick();
			}
			GameServer()->m_apPlayers[i]->m_IsReadyToPlay = true;
		}
	}
}